

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall amrex::ParmParse::getkth(ParmParse *this,char *name,int k,bool *ptr,int ival)

{
  char *in_RSI;
  string *in_RDI;
  bool *in_stack_ffffffffffffff58;
  Table *table;
  allocator local_69;
  string local_68 [16];
  string *in_stack_ffffffffffffffa8;
  ParmParse *in_stack_ffffffffffffffb0;
  string local_48 [72];
  
  table = (Table *)in_RDI[2].field_2._M_allocated_capacity;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,in_RSI,&local_69);
  prefixedName(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  anon_unknown_12::anon_unknown_0::sgetval<bool>(table,in_RDI,in_stack_ffffffffffffff58,0,0xf07c02);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  return;
}

Assistant:

void
ParmParse::getkth (const char* name,
                   int         k,
                   bool&        ptr,
                   int         ival) const
{
    sgetval(m_table, prefixedName(name),ptr,ival,k);
}